

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# uv-common.c
# Opt level: O3

char * uv_strerror_r(int err,char *buf,size_t buflen)

{
  char *pcVar1;
  
  if (err < -0x7d) {
    if (err < -0xfbc) {
      if (err == -0xfff) {
        pcVar1 = "end of file";
      }
      else if (err == -0xffe) {
        pcVar1 = "unknown error";
      }
      else {
        if (err != -0xff0) goto switchD_004bdfd6_caseD_ffffff84;
        pcVar1 = "invalid Unicode character";
      }
      goto LAB_004be5e5;
    }
    switch(err) {
    case -0xbc6:
      pcVar1 = "resolved protocol is unknown";
      break;
    case -0xbc5:
      pcVar1 = "invalid value for hints";
      break;
    case -0xbc4:
switchD_004bdfd6_caseD_ffffff84:
      snprintf(buf,buflen,"Unknown system error %d");
      return buf;
    case -0xbc3:
      pcVar1 = "socket type not supported";
      break;
    case -0xbc2:
      pcVar1 = "service not available for socket type";
      break;
    case -0xbc1:
      pcVar1 = "argument buffer overflow";
      break;
    case -0xbc0:
      pcVar1 = "unknown node or service";
      break;
    case -0xbbf:
      pcVar1 = "no address";
      break;
    case -0xbbe:
      pcVar1 = "out of memory";
      break;
    case -0xbbd:
      pcVar1 = "ai_family not supported";
      break;
    case -0xbbc:
      pcVar1 = "permanent failure";
      break;
    case -0xbbb:
      pcVar1 = "request canceled";
      break;
    case -0xbba:
      pcVar1 = "bad ai_flags value";
      break;
    case -0xbb9:
      pcVar1 = "temporary failure";
      break;
    case -3000:
      goto switchD_004bdfd6_caseD_ffffff9f;
    default:
      if (err != -0xfbc) goto switchD_004bdfd6_caseD_ffffff84;
      pcVar1 = "inappropriate file type or format";
    }
  }
  else {
    switch(err) {
    case -0x7d:
      pcVar1 = "operation canceled";
      break;
    default:
      goto switchD_004bdfd6_caseD_ffffff84;
    case -0x79:
      pcVar1 = "remote I/O error";
      break;
    case -0x72:
      pcVar1 = "connection already in progress";
      break;
    case -0x71:
      pcVar1 = "host is unreachable";
      break;
    case -0x70:
      pcVar1 = "host is down";
      break;
    case -0x6f:
      pcVar1 = "connection refused";
      break;
    case -0x6e:
      pcVar1 = "connection timed out";
      break;
    case -0x6c:
      pcVar1 = "cannot send after transport endpoint shutdown";
      break;
    case -0x6b:
      pcVar1 = "socket is not connected";
      break;
    case -0x6a:
      pcVar1 = "socket is already connected";
      break;
    case -0x69:
      pcVar1 = "no buffer space available";
      break;
    case -0x68:
      pcVar1 = "connection reset by peer";
      break;
    case -0x67:
      pcVar1 = "software caused connection abort";
      break;
    case -0x65:
      pcVar1 = "network is unreachable";
      break;
    case -100:
      pcVar1 = "network is down";
      break;
    case -99:
      pcVar1 = "address not available";
      break;
    case -0x62:
      pcVar1 = "address already in use";
      break;
    case -0x61:
switchD_004bdfd6_caseD_ffffff9f:
      pcVar1 = "address family not supported";
      break;
    case -0x5f:
      pcVar1 = "operation not supported on socket";
      break;
    case -0x5d:
      pcVar1 = "protocol not supported";
      break;
    case -0x5c:
      pcVar1 = "protocol not available";
      break;
    case -0x5b:
      pcVar1 = "protocol wrong type for socket";
      break;
    case -0x5a:
      pcVar1 = "message too long";
      break;
    case -0x59:
      pcVar1 = "destination address required";
      break;
    case -0x58:
      pcVar1 = "socket operation on non-socket";
      break;
    case -0x47:
      pcVar1 = "protocol error";
      break;
    case -0x40:
      pcVar1 = "machine is not on the network";
      break;
    case -0x28:
      pcVar1 = "too many symbolic links encountered";
      break;
    case -0x27:
      pcVar1 = "directory not empty";
      break;
    case -0x26:
      pcVar1 = "function not implemented";
      break;
    case -0x24:
      pcVar1 = "name too long";
      break;
    case -0x22:
      pcVar1 = "result too large";
      break;
    case -0x20:
      pcVar1 = "broken pipe";
      break;
    case -0x1f:
      pcVar1 = "too many links";
      break;
    case -0x1e:
      pcVar1 = "read-only file system";
      break;
    case -0x1d:
      pcVar1 = "invalid seek";
      break;
    case -0x1c:
      pcVar1 = "no space left on device";
      break;
    case -0x1b:
      pcVar1 = "file too large";
      break;
    case -0x1a:
      pcVar1 = "text file is busy";
      break;
    case -0x19:
      pcVar1 = "inappropriate ioctl for device";
      break;
    case -0x18:
      pcVar1 = "too many open files";
      break;
    case -0x17:
      pcVar1 = "file table overflow";
      break;
    case -0x16:
      pcVar1 = "invalid argument";
      break;
    case -0x15:
      pcVar1 = "illegal operation on a directory";
      break;
    case -0x14:
      pcVar1 = "not a directory";
      break;
    case -0x13:
      pcVar1 = "no such device";
      break;
    case -0x12:
      pcVar1 = "cross-device link not permitted";
      break;
    case -0x11:
      pcVar1 = "file already exists";
      break;
    case -0x10:
      pcVar1 = "resource busy or locked";
      break;
    case -0xe:
      pcVar1 = "bad address in system call argument";
      break;
    case -0xd:
      pcVar1 = "permission denied";
      break;
    case -0xc:
      pcVar1 = "not enough memory";
      break;
    case -0xb:
      pcVar1 = "resource temporarily unavailable";
      break;
    case -9:
      pcVar1 = "bad file descriptor";
      break;
    case -7:
      pcVar1 = "argument list too long";
      break;
    case -6:
      pcVar1 = "no such device or address";
      break;
    case -5:
      pcVar1 = "i/o error";
      break;
    case -4:
      pcVar1 = "interrupted system call";
      break;
    case -3:
      pcVar1 = "no such process";
      break;
    case -2:
      pcVar1 = "no such file or directory";
      break;
    case -1:
      pcVar1 = "operation not permitted";
    }
  }
LAB_004be5e5:
  snprintf(buf,buflen,"%s",pcVar1);
  return buf;
}

Assistant:

char* uv_strerror_r(int err, char* buf, size_t buflen) {
  switch (err) {
    UV_ERRNO_MAP(UV_STRERROR_GEN_R)
    default: snprintf(buf, buflen, "Unknown system error %d", err);
  }
  return buf;
}